

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O3

void yprp_stmt(lys_ypr_ctx_conflict *pctx,lysp_stmt *stmt)

{
  byte bVar1;
  uint16_t uVar2;
  char *pcVar3;
  char *attr_name;
  char *attr_value;
  byte flag;
  lysp_stmt *stmt_00;
  
  flag = -(stmt->child == (lysp_stmt *)0x0) | 1;
  pcVar3 = lys_stmt_str(stmt->kw);
  if (pcVar3 == (char *)0x0) {
    if (stmt->kw != LY_STMT_EXTENSION_INSTANCE) goto LAB_00192c65;
    pcVar3 = stmt->stmt;
    attr_value = stmt->arg;
    if (attr_value == (char *)0x0) {
      attr_value = (char *)0x0;
    }
    else if (*attr_value != '\0') {
      attr_name = lys_stmt_arg(LY_STMT_VALUE);
      attr_value = stmt->arg;
      goto LAB_00192c60;
    }
    attr_name = (char *)0x0;
  }
  else {
    bVar1 = lys_stmt_flags(stmt->kw);
    pcVar3 = stmt->stmt;
    if ((bVar1 & 1) != 0) {
      ypr_open(pctx,pcVar3,(char *)0x0,(char *)0x0,flag);
      pcVar3 = lys_stmt_arg(stmt->kw);
      ypr_yin_arg(pctx,pcVar3,stmt->arg);
      goto LAB_00192c65;
    }
    attr_name = lys_stmt_arg(stmt->kw);
    attr_value = stmt->arg;
  }
LAB_00192c60:
  ypr_open(pctx,pcVar3,attr_name,attr_value,flag);
LAB_00192c65:
  if (stmt->child == (lysp_stmt *)0x0) {
    return;
  }
  uVar2 = (uint16_t)*(undefined4 *)((long)&pctx->field_0 + 8);
  (pctx->field_0).field_0.level = uVar2 + 1;
  stmt_00 = stmt->child;
  if (stmt_00 != (lysp_stmt *)0x0) {
    do {
      yprp_stmt(pctx,stmt_00);
      stmt_00 = stmt_00->next;
    } while (stmt_00 != (lysp_stmt *)0x0);
    uVar2 = (short)*(undefined4 *)((long)&pctx->field_0 + 8) - 1;
  }
  (pctx->field_0).field_0.level = uVar2;
  ypr_close(pctx,stmt->stmt,flag);
  return;
}

Assistant:

static void
yprp_stmt(struct lys_ypr_ctx *pctx, struct lysp_stmt *stmt)
{
    struct lysp_stmt *childstmt;
    int8_t flag = stmt->child ? 1 : -1;

    if (lys_stmt_str(stmt->kw)) {
        if (lys_stmt_flags(stmt->kw) & LY_STMT_FLAG_YIN) {
            ypr_open(pctx, stmt->stmt, NULL, NULL, flag);
            ypr_yin_arg(pctx, lys_stmt_arg(stmt->kw), stmt->arg);
        } else {
            ypr_open(pctx, stmt->stmt, lys_stmt_arg(stmt->kw), stmt->arg, flag);
        }
    } else if (stmt->kw == LY_STMT_EXTENSION_INSTANCE) {
        ypr_open(pctx, stmt->stmt, (stmt->arg && stmt->arg[0]) ? lys_stmt_arg(LY_STMT_VALUE) : NULL, stmt->arg, flag);
    }

    if (stmt->child) {
        LEVEL++;
        LY_LIST_FOR(stmt->child, childstmt) {
            yprp_stmt(pctx, childstmt);
        }
        LEVEL--;
        ypr_close(pctx, stmt->stmt, flag);
    }
}